

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgroupbox.cpp
# Opt level: O1

void __thiscall QGroupBox::mouseReleaseEvent(QGroupBox *this,QMouseEvent *event)

{
  QGroupBoxPrivate *this_00;
  QRect QVar1;
  undefined4 uVar2;
  uint uVar3;
  int iVar4;
  QStyle *pQVar5;
  ulong uVar6;
  ulong uVar7;
  long in_FS_OFFSET;
  double extraout_XMM0_Qa;
  undefined1 auVar8 [16];
  double extraout_XMM1_Qa;
  undefined1 auVar9 [16];
  QStyleOptionGroupBox box;
  QRect local_c8;
  QStyleOptionGroupBox local_b8;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  if ((*(int *)(event + 0x40) == 1) &&
     (this_00 = *(QGroupBoxPrivate **)&(this->super_QWidget).field_0x8,
     this_00->overCheckBox != false)) {
    memset(&local_b8,0xaa,0x88);
    QStyleOptionGroupBox::QStyleOptionGroupBox(&local_b8);
    (**(code **)(*(long *)&this->super_QWidget + 0x1a0))(this,&local_b8);
    pQVar5 = QWidget::style(&this->super_QWidget);
    uVar2 = QEventPoint::position();
    auVar9._0_8_ = (double)((ulong)extraout_XMM1_Qa & 0x8000000000000000 | 0x3fe0000000000000) +
                   extraout_XMM1_Qa;
    auVar9._8_8_ = (double)((ulong)extraout_XMM0_Qa & 0x8000000000000000 | 0x3fe0000000000000) +
                   extraout_XMM0_Qa;
    auVar9 = minpd(_DAT_0066f5d0,auVar9);
    auVar8._8_8_ = -(ulong)(-2147483648.0 < auVar9._8_8_);
    auVar8._0_8_ = -(ulong)(-2147483648.0 < auVar9._0_8_);
    uVar3 = movmskpd(uVar2,auVar8);
    uVar7 = 0x8000000000000000;
    if ((uVar3 & 1) != 0) {
      uVar7 = (ulong)(uint)(int)auVar9._0_8_ << 0x20;
    }
    uVar6 = 0x80000000;
    if ((uVar3 & 2) != 0) {
      uVar6 = (ulong)(uint)(int)auVar9._8_8_;
    }
    local_c8._0_8_ = uVar6 | uVar7;
    iVar4 = (**(code **)(*(long *)pQVar5 + 0xd0))(pQVar5,7,&local_b8,&local_c8,this);
    QVar1.x2.m_i = local_c8.x2.m_i;
    QVar1.y2.m_i = local_c8.y2.m_i;
    QVar1.x1.m_i = local_c8.x1.m_i;
    QVar1.y1.m_i = local_c8.y1.m_i;
    this_00->pressedControl = SC_None;
    this_00->overCheckBox = false;
    if (iVar4 - 1U < 2 && this_00->checkable == true) {
      QGroupBoxPrivate::click(this_00);
      QVar1.x2.m_i = local_c8.x2.m_i;
      QVar1.y2.m_i = local_c8.y2.m_i;
      QVar1.x1.m_i = local_c8.x1.m_i;
      QVar1.y1.m_i = local_c8.y1.m_i;
    }
    else if (this_00->checkable != false) {
      pQVar5 = QWidget::style(&this->super_QWidget);
      local_c8 = (QRect)(**(code **)(*(long *)pQVar5 + 0xd8))(pQVar5,7,&local_b8,1,this);
      QWidget::update(&this->super_QWidget,&local_c8);
      QVar1 = local_c8;
    }
    local_c8 = QVar1;
    if (&(local_b8.text.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_b8.text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_b8.text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_b8.text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
      {
        QArrayData::deallocate(&(local_b8.text.d.d)->super_QArrayData,2,0x10);
      }
    }
    QStyleOption::~QStyleOption((QStyleOption *)&local_b8);
  }
  else {
    event[0xc] = (QMouseEvent)0x0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGroupBox::mouseReleaseEvent(QMouseEvent *event)
{
    if (event->button() != Qt::LeftButton) {
        event->ignore();
        return;
    }

    Q_D(QGroupBox);
    if (!d->overCheckBox) {
        event->ignore();
        return;
    }
    QStyleOptionGroupBox box;
    initStyleOption(&box);
    QStyle::SubControl released = style()->hitTestComplexControl(QStyle::CC_GroupBox, &box,
                                                                 event->position().toPoint(), this);
    bool toggle = d->checkable && (released == QStyle::SC_GroupBoxLabel
                                   || released == QStyle::SC_GroupBoxCheckBox);
    d->pressedControl = QStyle::SC_None;
    d->overCheckBox = false;
    if (toggle)
        d->click();
    else if (d->checkable)
        update(style()->subControlRect(QStyle::CC_GroupBox, &box, QStyle::SC_GroupBoxCheckBox, this));
}